

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::segment::CostQueue::push(CostQueue *this,float cost,uint32_t face)

{
  bool bVar1;
  uint32_t uVar2;
  Pair *pPVar3;
  float fVar4;
  uint32_t local_24;
  uint32_t count;
  uint32_t i;
  Pair p;
  uint32_t face_local;
  float cost_local;
  CostQueue *this_local;
  
  count = (uint32_t)cost;
  i = face;
  p.cost = (float)face;
  p.face = (uint32_t)cost;
  bVar1 = Array<xatlas::internal::segment::CostQueue::Pair>::isEmpty(&this->m_pairs);
  uVar2 = p.face;
  if ((bVar1) || (fVar4 = peekCost(this), (float)uVar2 < fVar4)) {
    Array<xatlas::internal::segment::CostQueue::Pair>::push_back(&this->m_pairs,(Pair *)&count);
  }
  else {
    local_24 = 0;
    uVar2 = Array<xatlas::internal::segment::CostQueue::Pair>::size(&this->m_pairs);
    while ((local_24 < uVar2 &&
           (pPVar3 = Array<xatlas::internal::segment::CostQueue::Pair>::operator[]
                               (&this->m_pairs,local_24), (float)p.face <= pPVar3->cost))) {
      local_24 = local_24 + 1;
    }
    Array<xatlas::internal::segment::CostQueue::Pair>::insertAt
              (&this->m_pairs,local_24,(Pair *)&count);
    uVar2 = Array<xatlas::internal::segment::CostQueue::Pair>::size(&this->m_pairs);
    if (this->m_maxSize < uVar2) {
      Array<xatlas::internal::segment::CostQueue::Pair>::removeAt(&this->m_pairs,0);
    }
  }
  return;
}

Assistant:

void push(float cost, uint32_t face)
	{
		const Pair p = { cost, face };
		if (m_pairs.isEmpty() || cost < peekCost())
			m_pairs.push_back(p);
		else {
			uint32_t i = 0;
			const uint32_t count = m_pairs.size();
			for (; i < count; i++) {
				if (m_pairs[i].cost < cost)
					break;
			}
			m_pairs.insertAt(i, p);
			if (m_pairs.size() > m_maxSize)
				m_pairs.removeAt(0);
		}
	}